

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusreply.h
# Opt level: O0

QDBusReply<QDBusObjectPath> * __thiscall
QDBusReply<QDBusObjectPath>::operator=(QDBusReply<QDBusObjectPath> *this,QDBusMessage *reply)

{
  QMetaType v;
  QDBusMessage *in_RSI;
  QDBusReply<QDBusObjectPath> *in_RDI;
  long in_FS_OFFSET;
  QVariant data;
  QDBusObjectPath *in_stack_ffffffffffffff88;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._16_8_ = 0xaaaaaaaaaaaaaaaa;
  uStack_10 = 0xaaaaaaaaaaaaaaaa;
  local_28.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_28._8_8_ = 0xaaaaaaaaaaaaaaaa;
  v = QMetaType::fromType<QDBusObjectPath>();
  QVariant::QVariant((QVariant *)&local_28,v,(void *)0x0);
  qDBusReplyFill(in_RSI,&in_RDI->m_error,(QVariant *)local_28.data);
  qvariant_cast<QDBusObjectPath>((QVariant *)v.d_ptr);
  QDBusObjectPath::operator=((QDBusObjectPath *)in_RDI,in_stack_ffffffffffffff88);
  QDBusObjectPath::~QDBusObjectPath((QDBusObjectPath *)0x12b899);
  QVariant::~QVariant((QVariant *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QDBusReply& operator=(const QDBusMessage &reply)
    {
        QVariant data(QMetaType::fromType<Type>());
        qDBusReplyFill(reply, m_error, data);
        m_data = qvariant_cast<Type>(data);
        return *this;
    }